

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.hpp
# Opt level: O1

void __thiscall mesh<double>::mesh(mesh<double> *this,string *file,shared_ptr<material<double>_> *m)

{
  vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_> *this_00;
  pointer *ppvVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  iterator __position;
  pointer pvVar4;
  char cVar5;
  istream *piVar6;
  long lVar7;
  pointer pbVar8;
  long lVar9;
  pointer pbVar10;
  int *piVar11;
  undefined8 uVar12;
  pointer pbVar13;
  pointer pbVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  vec3<double> local_4f8;
  undefined1 local_4d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  pointer local_4c0;
  string line;
  string op;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  double local_448;
  double dStack_440;
  double local_438;
  undefined8 uStack_430;
  undefined1 local_428 [16];
  value_type local_418;
  shared_ptr<material<double>_> *local_400;
  pointer local_3f8;
  pointer local_3e8;
  pointer local_3d8;
  stringstream lstream;
  ostream local_3b0 [112];
  ios_base local_340 [264];
  ifstream file_;
  
  (this->super_hit<double>)._vptr_hit = (_func_int **)&PTR_is_hit_0010ecf0;
  (this->m_).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (m->super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (m->super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->m_).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_400 = m;
  std::ifstream::ifstream(&this->file_);
  (this->max_).e[1] = 0.0;
  (this->max_).e[2] = 0.0;
  (this->min_).e[2] = 0.0;
  (this->max_).e[0] = 0.0;
  (this->min_).e[0] = 0.0;
  (this->min_).e[1] = 0.0;
  (this->faces).super_hit<double>._vptr_hit = (_func_int **)&PTR_is_hit_0010e8b8;
  this_00 = &(this->faces).obj_list;
  (this->faces).obj_list.
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->faces).obj_list.
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces).obj_list.
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&file_,(string *)file,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&lstream);
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428._8_8_ = 0x4024000000000000;
  local_428._0_8_ = 0x4024000000000000;
  local_438 = 0.0;
  uStack_430 = 0;
  local_4c0 = (pointer)0x4024000000000000;
  local_448 = 0.0;
  dStack_440 = 0.0;
  pbVar10 = local_4c0;
LAB_00107f43:
  do {
    while( true ) {
      local_4c0 = pbVar10;
      cVar5 = std::ios::widen((char)*(undefined8 *)(_file_ + -0x18) + (char)&file_);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&file_,(string *)&line,cVar5);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
        (this->min_).e[0] = (double)local_428._0_8_;
        (this->min_).e[1] = (double)local_428._8_8_;
        (this->min_).e[2] = (double)local_4c0;
        (this->max_).e[0] = local_448;
        (this->max_).e[1] = dStack_440;
        (this->max_).e[2] = local_438;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4d8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&lstream);
        std::ios_base::~ios_base(local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)op._M_dataplus._M_p != &op.field_2) {
          operator_delete(op._M_dataplus._M_p,
                          CONCAT71(op.field_2._M_allocated_capacity._1_7_,op.field_2._M_local_buf[0]
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)line._M_dataplus._M_p != &line.field_2) {
          operator_delete(line._M_dataplus._M_p,
                          CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                   line.field_2._M_local_buf[0]) + 1);
        }
        std::ifstream::~ifstream(&file_);
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (local_3b0,line._M_dataplus._M_p,line._M_string_length);
      std::operator>>((istream *)&lstream,(string *)&op);
      split<double>(&local_468,&line,' ');
      local_4f8.e[2] =
           (double)local_4d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_4f8.e[1] =
           (double)local_4d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      local_4f8.e[0] =
           (double)local_4d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_4d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_4f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_468);
      if (*line._M_dataplus._M_p != 'f') break;
      pbVar10 = (pointer)local_4d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      piVar11 = __errno_location();
      iVar2 = *piVar11;
      *piVar11 = 0;
      lVar7 = strtol((char *)pbVar10,(char **)&local_4f8,10);
      if ((pointer)local_4f8.e[0] == pbVar10) {
LAB_001085a2:
        std::__throw_invalid_argument("stoi");
        pbVar8 = pbVar10;
LAB_001085ae:
        std::__throw_out_of_range("stoi");
LAB_001085ba:
        std::__throw_out_of_range("stoi");
        pbVar10 = pbVar8;
LAB_001085c9:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   pbVar10);
LAB_001085da:
        std::__throw_invalid_argument("stod");
        goto LAB_001085e6;
      }
      pbVar8 = pbVar10;
      if ((lVar7 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_001085ae;
      if (*piVar11 == 0) {
        *piVar11 = iVar2;
      }
      pbVar13 = (pointer)local_4d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
      iVar2 = *piVar11;
      *piVar11 = 0;
      pbVar8 = (pointer)strtol((char *)pbVar13,(char **)&local_4f8,10);
      if ((pointer)local_4f8.e[0] == pbVar13) {
        std::__throw_invalid_argument("stoi");
LAB_00108596:
        std::__throw_out_of_range("stoi");
        goto LAB_001085a2;
      }
      pbVar10 = pbVar8;
      if ((pbVar8 + -0x4000000 < (pointer)0xffffffff00000000) || (*piVar11 == 0x22))
      goto LAB_00108596;
      if (*piVar11 == 0) {
        *piVar11 = iVar2;
      }
      pbVar10 = (pointer)local_4d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
      iVar2 = *piVar11;
      *piVar11 = 0;
      lVar9 = strtol((char *)pbVar10,(char **)&local_4f8,10);
      if ((pointer)local_4f8.e[0] == pbVar10) {
        pbVar10 = (pointer)std::__throw_invalid_argument("stoi");
        goto LAB_001085c9;
      }
      if ((lVar9 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_001085ba;
      if (*piVar11 == 0) {
        *piVar11 = iVar2;
      }
      pbVar14 = (pointer)((lVar7 << 0x20) + -0x100000000 >> 0x20);
      pvVar4 = (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pbVar13 = (pointer)(((long)(this->verts).
                                 super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
                         -0x5555555555555555);
      pbVar10 = pbVar14;
      if (pbVar13 < pbVar14 || (long)pbVar13 - (long)pbVar14 == 0) goto LAB_001085c9;
      pbVar8 = (pointer)(((long)pbVar8 << 0x20) + -0x100000000 >> 0x20);
      pbVar10 = pbVar8;
      if ((pbVar13 < pbVar8 || (long)pbVar13 - (long)pbVar8 == 0) ||
         (pbVar10 = (pointer)((lVar9 << 0x20) + -0x100000000 >> 0x20),
         pbVar13 < pbVar10 || (long)pbVar13 - (long)pbVar10 == 0)) goto LAB_001085c9;
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_468.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      local_4f8.e[0] = 0.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<triangle<double>,std::allocator<triangle<double>>,vec3<double>&,vec3<double>&,vec3<double>&,int,std::shared_ptr<material<double>>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4f8.e + 1),
                 (triangle<double> **)&local_4f8,(allocator<triangle<double>_> *)&local_4d9,
                 pvVar4 + (long)pbVar14,pvVar4 + (long)pbVar8,pvVar4 + (long)pbVar10,
                 (int *)&local_468,local_400);
      local_418.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_4f8.e[0];
      local_418.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8.e[1];
      local_4f8.e[0] = 0.0;
      local_4f8.e[1] = 0.0;
      std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
      push_back(this_00,&local_418);
      if ((pointer)local_418.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_418.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      pbVar10 = local_4c0;
      if ((pointer)local_4f8.e[1] != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f8.e[1]);
        pbVar10 = local_4c0;
      }
    }
    pbVar10 = local_4c0;
  } while (*line._M_dataplus._M_p != 'v');
  pbVar10 = (pointer)local_4d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  piVar11 = __errno_location();
  iVar2 = *piVar11;
  *piVar11 = 0;
  local_3d8 = (pointer)strtod((char *)pbVar10,(char **)&local_4f8);
  if ((pointer)local_4f8.e[0] == pbVar10) {
LAB_001085e6:
    std::__throw_invalid_argument("stod");
LAB_001085f2:
    std::__throw_invalid_argument("stod");
LAB_001085fe:
    std::__throw_out_of_range("stod");
  }
  else {
    if (*piVar11 != 0) {
      if (*piVar11 != 0x22) goto LAB_001082f6;
      goto LAB_001085fe;
    }
    *piVar11 = iVar2;
LAB_001082f6:
    pbVar10 = (pointer)local_4d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    iVar2 = *piVar11;
    *piVar11 = 0;
    local_3e8 = (pointer)strtod((char *)pbVar10,(char **)&local_4f8);
    if ((pointer)local_4f8.e[0] == pbVar10) goto LAB_001085f2;
    if (*piVar11 == 0) {
      *piVar11 = iVar2;
LAB_00108342:
      pbVar10 = (pointer)local_4d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
      iVar2 = *piVar11;
      *piVar11 = 0;
      local_3f8 = (pointer)strtod((char *)pbVar10,(char **)&local_4f8);
      if ((pointer)local_4f8.e[0] == pbVar10) goto LAB_001085da;
      if (*piVar11 == 0) {
        *piVar11 = iVar2;
      }
      else if (*piVar11 == 0x22) goto LAB_00108616;
      local_4f8.e[0] = (double)local_3d8;
      local_4f8.e[1] = (double)local_3e8;
      __position._M_current =
           (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_4f8.e[2] = (double)local_3f8;
      if (__position._M_current ==
          (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<vec3<double>,std::allocator<vec3<double>>>::_M_realloc_insert<vec3<double>>
                  ((vector<vec3<double>,std::allocator<vec3<double>>> *)&this->verts,__position,
                   &local_4f8);
      }
      else {
        (__position._M_current)->e[2] = (double)local_3f8;
        (__position._M_current)->e[0] = (double)local_3d8;
        (__position._M_current)->e[1] = (double)local_3e8;
        ppvVar1 = &(this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      auVar17._8_8_ = local_3e8;
      auVar17._0_8_ = local_3d8;
      uVar15 = -(ulong)(local_428._0_8_ < (double)local_3d8);
      uVar16 = -(ulong)(local_428._8_8_ < (double)local_3e8);
      local_448 = (double)(~uVar15 & (ulong)local_448 | (ulong)local_3d8 & uVar15);
      dStack_440 = (double)(~uVar16 & (ulong)dStack_440 | (ulong)local_3e8 & uVar16);
      local_438 = (double)(~-(ulong)((double)local_4c0 < (double)local_3f8) & (ulong)local_438 |
                          -(ulong)((double)local_4c0 < (double)local_3f8) & (ulong)local_3f8);
      local_428 = minpd(auVar17,local_428);
      pbVar10 = local_3f8;
      if ((double)local_4c0 <= (double)local_3f8) {
        pbVar10 = local_4c0;
      }
      goto LAB_00107f43;
    }
    if (*piVar11 != 0x22) goto LAB_00108342;
  }
  std::__throw_out_of_range("stod");
LAB_00108616:
  uVar12 = std::__throw_out_of_range("stod");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&lstream);
  std::ios_base::~ios_base(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != &op.field_2) {
    operator_delete(op._M_dataplus._M_p,
                    CONCAT71(op.field_2._M_allocated_capacity._1_7_,op.field_2._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)line._M_dataplus._M_p != &line.field_2) {
    operator_delete(line._M_dataplus._M_p,
                    CONCAT71(line.field_2._M_allocated_capacity._1_7_,line.field_2._M_local_buf[0])
                    + 1);
  }
  std::ifstream::~ifstream(&file_);
  pvVar4 = (this->verts).super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar4 != (pointer)0x0) {
    operator_delete(pvVar4,(long)(this->verts).
                                 super__Vector_base<vec3<double>,_std::allocator<vec3<double>_>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  (this->faces).super_hit<double>._vptr_hit = (_func_int **)&PTR_is_hit_0010e8b8;
  std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
  ~vector(this_00);
  std::ifstream::~ifstream(&this->file_);
  p_Var3 = (this->m_).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  _Unwind_Resume(uVar12);
}

Assistant:

mesh<T>::mesh(const std::string& file, std::shared_ptr<material<T>> m) : m_(m) {
  std::ifstream file_(file);
  std::string line, op;
  std::stringstream lstream;
  std::vector<std::string> ss;

  vec3<T> temp_pos;
  T x, y, z;
  int count{0};
  int i = 0;
  T minx(10), miny(10), minz(10);
  T maxx(0), maxy(0), maxz(0);
  while (std::getline(file_, line)) {
    lstream << line;
    lstream >> op;
    ss = split<T>(line, ' ');
    // std::cerr << ss[0] << "\n";
    if (line[0] == 'v') {
      // std::cerr << "PRINT \n";
      // lstream >> x >> y >> z;
      x = std::stod(ss[1]);
      y = std::stod(ss[2]);
      z = std::stod(ss[3]);
      if (x > minx)
        maxx = x;
      if (y > miny)
        maxy = y;
      if (z > minz)
        maxz = z;
      if (x < minx)
        minx = x;
      if (y < miny)
        miny = y;
      if (z < minz)
        minz = z;

      point3<T> temp_vert(x, y, z);
      verts.push_back(1.0 * temp_vert);
    } else if (line[0] == 'f') {
      int v0, v1, v2;
      v0 = std::stoi(ss[1]);
      v1 = std::stoi(ss[2]);
      v2 = std::stoi(ss[3]);
      // lstream >> v0 >> v1 >> v2;
      faces.add(std::make_shared<triangle<T>>(
          verts.at(v0 - 1), verts.at(v1 - 1), verts.at(v2 - 1), 0, m));
    }
  }
  min_ = point3<T>(minx, miny, minz);
  max_ = point3<T>(maxx, maxy, maxz);
}